

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int check_default(lys_type *type,char **value,lys_module *module,int tpdf)

{
  LY_DATA_TYPE LVar1;
  ly_ctx *ctx;
  char *__s;
  lys_node_leaf *plVar2;
  lys_tpdf *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  lys_tpdf *plVar6;
  lys_restr *plVar7;
  uint64_t uVar8;
  void **ppvVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  lys_module *plVar17;
  lys_type *plVar18;
  char cVar19;
  lys_tpdf *plVar20;
  bool bVar21;
  char *local_a0;
  char *s;
  lyd_node_leaf_list node;
  char *local_38;
  
  local_38 = (char *)0x0;
  if (value == (char **)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xd96,
                  "int check_default(struct lys_type *, const char **, struct lys_module *, int)");
  }
  ctx = module->ctx;
  node.value_str = (char *)0x0;
  node.value.binary = (char *)0x0;
  node.parent = (lyd_node *)0x0;
  node.hash = 0;
  node._52_4_ = 0;
  node.next = (lyd_node *)0x0;
  node.prev = (lyd_node *)0x0;
  node.validity = '\0';
  node._9_7_ = 0;
  node.attr = (lyd_attr *)0x0;
  s = (char *)0x0;
  node.schema = (lys_node *)0x0;
  LVar1 = type->base;
  iVar15 = 1;
  node._76_4_ = tpdf;
  if (LVar1 == LY_TYPE_DER) goto LAB_0011db39;
  cVar19 = (char)*(undefined2 *)&module->field_0x40;
  if (tpdf != 0) {
    if (LVar1 != LY_TYPE_IDENT || cVar19 < '\0') {
      if (tpdf == 0 || LVar1 != LY_TYPE_LEAFREF) goto LAB_0011d925;
      goto LAB_0011d91d;
    }
    __s = *value;
    iVar15 = 0;
    if (__s == (char *)0x0) goto LAB_0011db39;
    pcVar16 = strchr(__s,0x3a);
    if (pcVar16 != (char *)0x0) {
      local_38 = transform_schema2json(module,__s);
LAB_0011daee:
      lydict_remove(ctx,*value);
      *value = local_38;
      local_38 = (char *)0x0;
      iVar14 = 0;
      goto switchD_0011d9e4_caseD_3;
    }
    plVar17 = lys_main_module(module);
    iVar15 = asprintf(&local_a0,"%s:%s",plVar17->name,*value);
    if (iVar15 != -1) {
      local_38 = lydict_insert_zc(ctx,local_a0);
      goto LAB_0011daee;
    }
    goto LAB_0011db10;
  }
  if (-1 < cVar19) goto LAB_0011d91d;
LAB_0011d925:
  local_38 = lydict_insert(ctx,*value,0);
  if (local_38 != (char *)0x0) {
    if (type->base != LY_TYPE_EMPTY) {
      plVar20 = (lys_tpdf *)0x0;
      goto switchD_0011d9e4_caseD_b;
    }
    ly_vlog(ctx,LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default");
    ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "The \"empty\" data type cannot have a default value.");
    iVar14 = -1;
    goto switchD_0011d9e4_caseD_3;
  }
  plVar3 = type->der;
  do {
    plVar20 = plVar3;
    plVar3 = (plVar20->type).der;
    if (plVar3 == (lys_tpdf *)0x0) goto LAB_0011d9ba;
  } while (plVar20->dflt == (char *)0x0);
  local_38 = lydict_insert(ctx,plVar20->dflt,0);
LAB_0011d9ba:
  iVar15 = 0;
  if (local_38 == (char *)0x0) goto LAB_0011db39;
  iVar14 = 0;
  switch(type->base) {
  case LY_TYPE_BINARY:
  case LY_TYPE_DEC64:
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    bVar21 = (type->info).bits.bit == (lys_type_bit *)0x0;
    goto LAB_0011d9eb;
  case LY_TYPE_BITS:
  case LY_TYPE_ENUM:
    bVar21 = (type->info).bits.count == 0;
LAB_0011d9eb:
    if (bVar21) goto LAB_0011db39;
    break;
  case LY_TYPE_BOOL:
  case LY_TYPE_EMPTY:
  case LY_TYPE_INST:
  case LY_TYPE_LEAFREF:
    goto switchD_0011d9e4_caseD_3;
  case LY_TYPE_IDENT:
    plVar17 = lys_main_module(((plVar20->type).parent)->module);
    if ((plVar17->field_0x40 & 0x80) != 0) goto LAB_0011db39;
    module = plVar20->module;
    break;
  case LY_TYPE_STRING:
    if ((type->info).bits.bit == (lys_type_bit *)0x0) {
      bVar21 = (type->info).lref.target == (lys_node_leaf *)0x0;
      goto LAB_0011d9eb;
    }
    break;
  case LY_TYPE_UNION:
    break;
  default:
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
          );
    goto LAB_0011db30;
  }
switchD_0011d9e4_caseD_b:
  node.value_str = (char *)0x0;
  node.value.binary = (char *)0x0;
  node.parent = (lyd_node *)0x0;
  node.hash = 0;
  node._52_4_ = 0;
  node.next = (lyd_node *)0x0;
  node.prev = (lyd_node *)0x0;
  node.validity = '\0';
  node._9_7_ = 0;
  node.attr = (lyd_attr *)0x0;
  s = (char *)0x0;
  node.schema = (lys_node *)0x0;
  node._48_8_ = lydict_insert(ctx,local_38,0);
  node.value.int32 = type->base;
  if (node._76_4_ == 0) {
    s = (char *)type->parent;
LAB_0011dbc7:
    if (type->base == LY_TYPE_LEAFREF) {
      plVar2 = (type->info).lref.target;
      if (plVar2 != (lys_node_leaf *)0x0) {
        iVar15 = check_default(&plVar2->type,&local_38,module,0);
        if (iVar15 != 0) goto LAB_0011db39;
        if (*value != (char *)0x0) {
          lydict_remove(ctx,*value);
          *value = local_38;
          local_38 = (char *)0x0;
        }
LAB_0011d91d:
        iVar15 = 0;
        goto LAB_0011db39;
      }
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Default value \"%s\" cannot be checked in an unresolved leafref.");
      iVar14 = 1;
    }
    else {
      iVar15 = 1;
      plVar18 = lyp_parse_value(type,(char **)&node.hash,(lyxml_elem *)0x0,(lyd_node_leaf_list *)&s,
                                (lyd_attr *)0x0,module,1,1,0);
      if (plVar18 == (lys_type *)0x0) {
        if (plVar20 != (lys_tpdf *)0x0) {
          if (type->base == LY_TYPE_ENUM) {
            plVar3 = (type->der->type).der;
          }
          else {
            if (type->base != LY_TYPE_BITS) goto LAB_0011db39;
            plVar3 = (type->der->type).der;
          }
          if (plVar3 != (lys_tpdf *)0x0) {
            ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                    "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type."
                    ,local_38,type->parent->name,plVar20->name);
          }
        }
        goto LAB_0011db39;
      }
      if (local_38 == (char *)node._48_8_) goto LAB_0011d91d;
      if (local_38 != *value) {
        __assert_fail("ly_strequal(dflt, *value, 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0xe4b,
                      "int check_default(struct lys_type *, const char **, struct lys_module *, int)"
                     );
      }
      lydict_remove(ctx,*value);
      *value = (char *)node._48_8_;
      node.hash = 0;
      node._52_4_ = 0;
      iVar14 = 0;
    }
  }
  else {
    s = (char *)calloc(1,0xd0);
    if (((char **)s != (char **)0x0) &&
       (iVar15 = asprintf((char **)s,"typedef-%s-default",type->parent->name), iVar15 != -1)) {
      *(lys_module **)(s + 0x30) = module;
      uVar10 = type->value_flags;
      uVar11 = type->ext_size;
      uVar12 = type->field_0x6;
      uVar13 = type->field_0x7;
      uVar4 = *(undefined4 *)&type->ext;
      uVar5 = *(undefined4 *)((long)&type->ext + 4);
      plVar3 = type->der;
      plVar6 = type->parent;
      plVar7 = (type->info).binary.length;
      plVar2 = (type->info).lref.target;
      uVar8 = (type->info).dec64.div;
      ppvVar9 = (type->info).str.patterns_pcre;
      *(LY_DATA_TYPE *)(s + 0x80) = type->base;
      s[0x84] = uVar10;
      s[0x85] = uVar11;
      s[0x86] = uVar12;
      s[0x87] = uVar13;
      *(undefined4 *)(s + 0x88) = uVar4;
      *(undefined4 *)(s + 0x8c) = uVar5;
      *(lys_tpdf **)(s + 0x90) = plVar3;
      *(lys_tpdf **)(s + 0x98) = plVar6;
      *(lys_restr **)(s + 0xa0) = plVar7;
      *(lys_node_leaf **)(s + 0xa8) = plVar2;
      *(uint64_t *)(s + 0xb0) = uVar8;
      *(void ***)(s + 0xb8) = ppvVar9;
      goto LAB_0011dbc7;
    }
LAB_0011db10:
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","check_default");
LAB_0011db30:
    iVar14 = -1;
  }
switchD_0011d9e4_caseD_3:
  iVar15 = iVar14;
LAB_0011db39:
  lyd_free_value((lyd_val)node.value_str,node.value.uint32,node.value.uint64._4_1_,type,
                 (char *)node._48_8_,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
  lydict_remove(ctx,(char *)node._48_8_);
  if (s != (char *)0x0 && node._76_4_ != 0) {
    free(*(void **)s);
    free(s);
  }
  lydict_remove(ctx,local_38);
  return iVar15;
}

Assistant:

static int
check_default(struct lys_type *type, const char **value, struct lys_module *module, int tpdf)
{
    struct lys_tpdf *base_tpdf = NULL;
    struct lyd_node_leaf_list node;
    const char *dflt = NULL;
    char *s;
    int ret = EXIT_SUCCESS, r;
    struct ly_ctx *ctx = module->ctx;

    assert(value);
    memset(&node, 0, sizeof node);

    if (type->base <= LY_TYPE_DER) {
        /* the type was not resolved yet, nothing to do for now */
        ret = EXIT_FAILURE;
        goto cleanup;
    } else if (!tpdf && !module->implemented) {
        /* do not check defaults in not implemented module's data */
        goto cleanup;
    } else if (tpdf && !module->implemented && type->base == LY_TYPE_IDENT) {
        /* identityrefs are checked when instantiated in data instead of typedef,
         * but in typedef the value has to be modified to include the prefix */
        if (*value) {
            if (strchr(*value, ':')) {
                dflt = transform_schema2json(module, *value);
            } else {
                /* default prefix of the module where the typedef is defined */
                if (asprintf(&s, "%s:%s", lys_main_module(module)->name, *value) == -1) {
                    LOGMEM(ctx);
                    ret = -1;
                    goto cleanup;
                }
                dflt = lydict_insert_zc(ctx, s);
            }
            lydict_remove(ctx, *value);
            *value = dflt;
            dflt = NULL;
        }
        goto cleanup;
    } else if (type->base == LY_TYPE_LEAFREF && tpdf) {
        /* leafref in typedef cannot be checked */
        goto cleanup;
    }

    dflt = lydict_insert(ctx, *value, 0);
    if (!dflt) {
        /* we do not have a new default value, so is there any to check even, in some base type? */
        for (base_tpdf = type->der; base_tpdf->type.der; base_tpdf = base_tpdf->type.der) {
            if (base_tpdf->dflt) {
                dflt = lydict_insert(ctx, base_tpdf->dflt, 0);
                break;
            }
        }

        if (!dflt) {
            /* no default value, nothing to check, all is well */
            goto cleanup;
        }

        /* so there is a default value in a base type, but can the default value be no longer valid (did we define some new restrictions)? */
        switch (type->base) {
        case LY_TYPE_IDENT:
            if (lys_main_module(base_tpdf->type.parent->module)->implemented) {
                goto cleanup;
            } else {
                /* check the default value from typedef, but use also the typedef's module
                 * due to possible searching in imported modules which is expected in
                 * typedef's module instead of module where the typedef is used */
                module = base_tpdf->module;
            }
            break;
        case LY_TYPE_INST:
        case LY_TYPE_LEAFREF:
        case LY_TYPE_BOOL:
        case LY_TYPE_EMPTY:
            /* these have no restrictions, so we would do the exact same work as the unres in the base typedef */
            goto cleanup;
        case LY_TYPE_BITS:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.bits.count) {
                break;
            }
            goto cleanup;
        case LY_TYPE_ENUM:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.enums.count) {
                break;
            }
            goto cleanup;
        case LY_TYPE_DEC64:
            if (type->info.dec64.range) {
                break;
            }
            goto cleanup;
        case LY_TYPE_BINARY:
            if (type->info.binary.length) {
                break;
            }
            goto cleanup;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (type->info.num.range) {
                break;
            }
            goto cleanup;
        case LY_TYPE_STRING:
            if (type->info.str.length || type->info.str.patterns) {
                break;
            }
            goto cleanup;
        case LY_TYPE_UNION:
            /* way too much trouble learning whether we need to check the default again, so just do it */
            break;
        default:
            LOGINT(ctx);
            ret = -1;
            goto cleanup;
        }
    } else if (type->base == LY_TYPE_EMPTY) {
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", type->parent->name);
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "The \"empty\" data type cannot have a default value.");
        ret = -1;
        goto cleanup;
    }

    /* dummy leaf */
    memset(&node, 0, sizeof node);
    node.value_str = lydict_insert(ctx, dflt, 0);
    node.value_type = type->base;

    if (tpdf) {
        node.schema = calloc(1, sizeof (struct lys_node_leaf));
        if (!node.schema) {
            LOGMEM(ctx);
            ret = -1;
            goto cleanup;
        }
        r = asprintf((char **)&node.schema->name, "typedef-%s-default", ((struct lys_tpdf *)type->parent)->name);
        if (r == -1) {
            LOGMEM(ctx);
            ret = -1;
            goto cleanup;
        }
        node.schema->module = module;
        memcpy(&((struct lys_node_leaf *)node.schema)->type, type, sizeof *type);
    } else {
        node.schema = (struct lys_node *)type->parent;
    }

    if (type->base == LY_TYPE_LEAFREF) {
        if (!type->info.lref.target) {
            ret = EXIT_FAILURE;
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Default value \"%s\" cannot be checked in an unresolved leafref.",
                   dflt);
            goto cleanup;
        }
        ret = check_default(&type->info.lref.target->type, &dflt, module, 0);
        if (!ret) {
            /* adopt possibly changed default value to its canonical form */
            if (*value) {
                lydict_remove(ctx, *value);
                *value = dflt;
                dflt = NULL;
            }
        }
    } else {
        if (!lyp_parse_value(type, &node.value_str, NULL, &node, NULL, module, 1, 1, 0)) {
            /* possible forward reference */
            ret = EXIT_FAILURE;
            if (base_tpdf) {
                /* default value is defined in some base typedef */
                if ((type->base == LY_TYPE_BITS && type->der->type.der) ||
                        (type->base == LY_TYPE_ENUM && type->der->type.der)) {
                    /* we have refined bits/enums */
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL,
                           "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type.",
                           dflt, type->parent->name, base_tpdf->name);
                }
            }
        } else {
            /* success - adopt canonical form from the node into the default value */
            if (!ly_strequal(dflt, node.value_str, 1)) {
                /* this can happen only if we have non-inherited default value,
                 * inherited default values are already in canonical form */
                assert(ly_strequal(dflt, *value, 1));

                lydict_remove(ctx, *value);
                *value = node.value_str;
                node.value_str = NULL;
            }
        }
    }

cleanup:
    lyd_free_value(node.value, node.value_type, node.value_flags, type, node.value_str, NULL, NULL, NULL);
    lydict_remove(ctx, node.value_str);
    if (tpdf && node.schema) {
        free((char *)node.schema->name);
        free(node.schema);
    }
    lydict_remove(ctx, dflt);

    return ret;
}